

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::strengthenInequalities
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt *num_strengthened)

{
  uint uVar1;
  HighsLp *pHVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  HighsOptions *pHVar6;
  HPresolve *pHVar7;
  pointer piVar8;
  pointer pdVar9;
  undefined8 uVar10;
  uint uVar11;
  Result RVar12;
  int iVar13;
  undefined4 extraout_var;
  pointer piVar14;
  undefined4 extraout_var_00;
  pointer pdVar15;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  size_t i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var19;
  long lVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  vector<int,_std::allocator<int>_> *pvVar24;
  double dVar25;
  double dVar26;
  const_iterator cVar27;
  int *piVar28;
  double dVar29;
  HighsCDouble HVar30;
  int8_t comp;
  HPresolve *local_210;
  vector<int,_std::allocator<int>_> indices;
  double ub;
  anon_class_8_1_4c1942eb local_1e0;
  HighsCDouble *local_1d8;
  ulong local_1d0;
  HighsCDouble local_1c8;
  double threshold;
  HighsInt slackind;
  const_iterator local_1a8;
  undefined8 uStack_1a0;
  vector<double,_std::allocator<double>_> upper;
  vector<double,_std::allocator<double>_> reducedcost;
  vector<int,_std::allocator<int>_> cover;
  _Vector_base<int,_std::allocator<int>_> local_138;
  undefined8 local_120;
  double local_118;
  double local_110;
  anon_class_48_6_c3dafeef updateNonZeros;
  HighsCDouble local_d8;
  vector<int,_std::allocator<int>_> positions;
  vector<signed_char,_std::allocator<signed_char>_> complementation;
  vector<double,_std::allocator<double>_> coefs;
  
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coefs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  coefs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  coefs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  *num_strengthened = 0;
  local_120 = 0;
  uVar18 = 0;
  local_210 = this;
  while( true ) {
    pHVar2 = this->model;
    uVar10 = local_120;
    if (uVar18 == (uint)pHVar2->num_row_) break;
    uVar1 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar18];
    if ((1 < (long)(int)uVar1) &&
       ((pdVar15 = (pHVar2->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start, pdVar15[uVar18] <= -INFINITY ||
        (INFINITY <=
         (pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar18])))) {
      uVar11 = (pHVar2->num_col_ - this->numDeletedCols) / 0x14;
      if ((int)uVar11 < 0x3e9) {
        uVar11 = 1000;
      }
      if (uVar1 <= uVar11) {
        local_d8.hi = 0.0;
        local_d8.lo = 0.0;
        local_1c8.hi = pdVar15[uVar18];
        local_118 = -1.0;
        if (local_1c8.hi <= -INFINITY) {
          local_1c8.hi = -(pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar18];
          local_118 = 1.0;
        }
        local_1c8.lo = 0.0;
        if (complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
               .super__Vector_impl_data._M_start;
        }
        if (reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        if (positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        local_1d0 = uVar18;
        std::vector<signed_char,_std::allocator<signed_char>_>::reserve
                  (&complementation,(long)(int)uVar1);
        uVar18 = local_1d0;
        std::vector<double,_std::allocator<double>_>::reserve
                  (&reducedcost,
                   (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[local_1d0]);
        std::vector<double,_std::allocator<double>_>::reserve
                  (&upper,(long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar18]);
        std::vector<int,_std::allocator<int>_>::reserve
                  (&indices,(long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar18]);
        std::vector<int,_std::allocator<int>_>::reserve
                  (&positions,
                   (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar18]);
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)&local_138,
                   (long)(this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar18]);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&local_138,
                   (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar18);
        while (piVar8 = local_138._M_impl.super__Vector_impl_data._M_finish,
              piVar14 = local_138._M_impl.super__Vector_impl_data._M_start,
              local_138._M_impl.super__Vector_impl_data._M_start !=
              local_138._M_impl.super__Vector_impl_data._M_finish) {
          piVar4 = local_138._M_impl.super__Vector_impl_data._M_finish + -1;
          lVar16 = (long)local_138._M_impl.super__Vector_impl_data._M_finish[-1];
          threshold = (double)CONCAT44(threshold._4_4_,
                                       local_138._M_impl.super__Vector_impl_data._M_finish[-1]);
          piVar3 = (local_210->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_138._M_impl.super__Vector_impl_data._M_finish = piVar4;
          if (piVar3[lVar16] != -1) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&local_138,piVar3 + lVar16);
            lVar16 = (long)threshold._0_4_;
          }
          piVar4 = (local_210->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (piVar4[lVar16] != -1) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&local_138,piVar4 + lVar16);
            lVar16 = (long)threshold._0_4_;
          }
          pHVar2 = local_210->model;
          iVar13 = (local_210->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
          pdVar15 = (pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          if ((pdVar15[iVar13] <= -INFINITY) ||
             (pdVar5 = (pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start, INFINITY <= pdVar5[iVar13])) break;
          pvVar24 = (vector<int,_std::allocator<int>_> *)
                    ((local_210->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_start[lVar16] * local_118);
          dVar22 = pdVar5[iVar13] - pdVar15[iVar13];
          ub = dVar22;
          if ((double)pvVar24 <= 0.0) {
            comp = -1;
            dVar26 = pdVar15[iVar13] * (double)pvVar24;
            dVar29 = local_1c8.hi + dVar26;
            dVar26 = (local_1c8.hi - (dVar29 - dVar26)) + (dVar26 - (dVar29 - (dVar29 - dVar26)));
            pvVar24 = (vector<int,_std::allocator<int>_> *)-(double)pvVar24;
            local_1c8.hi = dVar29;
          }
          else {
            comp = '\x01';
            dVar26 = pdVar5[iVar13] * (double)pvVar24;
            dVar29 = local_1c8.hi + dVar26;
            dVar26 = (local_1c8.hi - (dVar29 - dVar26)) + (dVar26 - (dVar29 - (dVar29 - dVar26)));
            local_1c8.hi = dVar29;
          }
          local_1c8.lo = dVar26 + local_1c8.lo;
          updateNonZeros.indices = pvVar24;
          if ((local_210->primal_feastol < dVar22) && (local_210->primal_feastol < (double)pvVar24))
          {
            if ((pHVar2->integrality_).
                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                super__Vector_impl_data._M_start[iVar13] == kContinuous) {
              dVar22 = dVar22 * (double)pvVar24;
              dVar26 = dVar22 + local_d8.hi;
              local_d8.lo = (local_d8.hi - (dVar26 - dVar22)) +
                            (dVar22 - (dVar26 - (dVar26 - dVar22))) + local_d8.lo;
              local_d8.hi = dVar26;
            }
            else {
              slackind = (HighsInt)
                         ((ulong)((long)reducedcost.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)reducedcost.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 3);
              std::vector<int,_std::allocator<int>_>::emplace_back<int>(&indices,&slackind);
              std::vector<int,_std::allocator<int>_>::push_back
                        (&positions,(value_type_conflict2 *)&threshold);
              std::vector<double,_std::allocator<double>_>::push_back
                        (&reducedcost,(value_type_conflict1 *)&updateNonZeros);
              std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                        (&complementation,&comp);
              std::vector<double,_std::allocator<double>_>::push_back(&upper,&ub);
            }
          }
        }
        if (((local_1d0 & 100) == 0) ||
           ((int)uVar11 <
            (local_210->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_1d0] * 10)) {
          RVar12 = checkTimeLimit(local_210);
          uVar10 = CONCAT44(extraout_var,RVar12);
          if (RVar12 != kOk) break;
        }
        this = local_210;
        if (piVar14 == piVar8) {
          dVar22 = local_210->primal_feastol;
          if (local_1c8.hi + local_1c8.lo <= dVar22) {
            RVar12 = rowPresolve(local_210,postsolve_stack,(HighsInt)local_1d0);
            uVar18 = local_1d0;
            uVar10 = CONCAT44(extraout_var_00,RVar12);
            if (RVar12 != kOk) break;
          }
          else {
            dVar26 = (local_1c8.hi + local_1c8.lo) * dVar22;
            if (dVar26 <= dVar22 * 100.0) {
              dVar26 = dVar22 * 100.0;
            }
            while( true ) {
              HVar30 = HighsCDouble::operator-(&local_1c8,&local_d8);
              piVar8 = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              piVar14 = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((HVar30.lo + HVar30.hi <= dVar26) ||
                 (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish)) break;
              iVar13 = pdqsort_detail::log2<long>
                                 ((long)indices.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)indices.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 2);
              pdqsort_detail::
              pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0,false>
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar14,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)piVar8,
                         &reducedcost,iVar13,true);
              updateNonZeros._0_16_ = HighsCDouble::operator-(&local_1c8,&local_d8);
              if (cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
              }
              std::vector<int,_std::allocator<int>_>::reserve
                        (&cover,(long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2);
              lVar16 = (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2;
              while (bVar21 = lVar16 != 0, lVar16 = lVar16 + -1, bVar21) {
                iVar13 = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16];
                ub._0_4_ = iVar13;
                cVar27._M_current =
                     (int *)(upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar13] *
                            reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar13]);
                if (((1000.0 < upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar13]) ||
                    (reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar13] <= dVar26)) ||
                   (local_1a8._M_current = cVar27._M_current,
                   HVar30 = HighsCDouble::operator-
                                      ((HighsCDouble *)&updateNonZeros,(double)cVar27._M_current),
                   cVar27._M_current = local_1a8._M_current, dVar26 < HVar30.lo + HVar30.hi)) {
                  HighsCDouble::operator-=
                            ((HighsCDouble *)&updateNonZeros,(double)cVar27._M_current);
                }
                else {
                  std::vector<int,_std::allocator<int>_>::push_back
                            (&cover,(value_type_conflict2 *)&ub);
                }
              }
              if (cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) break;
              piVar14 = cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar28 = cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((double)updateNonZeros.indices + (double)updateNonZeros.reducedcost <= dVar26)
              break;
              while (piVar17 = piVar14, piVar28 = piVar28 + 1,
                    piVar28 !=
                    cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                dVar22 = reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[*piVar28];
                dVar29 = reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[*piVar17];
                if ((dVar22 <= 0.001) || (dVar29 <= 0.001)) {
                  bVar21 = dVar22 < dVar29;
                }
                else {
                  bVar21 = dVar29 < dVar22;
                }
                piVar14 = piVar28;
                if (bVar21 || dVar29 == dVar22) {
                  piVar14 = piVar17;
                }
              }
              dVar22 = reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[*piVar17];
              std::vector<double,_std::allocator<double>_>::resize
                        (&coefs,(long)cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2);
              pHVar7 = local_210;
              _ub = HighsCDouble::operator/((HighsCDouble *)&updateNonZeros,dVar22);
              HVar30 = HighsCDouble::operator-((HighsCDouble *)&ub,pHVar7->primal_feastol);
              dVar23 = ceil(HVar30.hi + HVar30.lo);
              pdVar9 = coefs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar14 = cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar5 = reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar15 = upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              dVar29 = 1.0;
              if (1.0 <= dVar23) {
                dVar29 = dVar23;
              }
              uStack_1a0 = 0x8000000000000000;
              ub = INFINITY;
              lVar20 = (long)cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              pHVar6 = pHVar7->options;
              local_110 = 0.0;
              local_1a8._M_current = (int *)((ulong)dVar29 ^ 0x8000000000000000);
              for (lVar16 = 0; lVar20 >> 2 != lVar16; lVar16 = lVar16 + 1) {
                iVar13 = piVar14[lVar16];
                dVar23 = pdVar5[iVar13];
                dVar25 = (double)updateNonZeros.indices + (double)updateNonZeros.reducedcost;
                if (dVar23 <= (double)updateNonZeros.indices + (double)updateNonZeros.reducedcost) {
                  dVar25 = dVar23;
                }
                dVar23 = ceil(dVar25 / dVar22 -
                              (pHVar6->super_HighsOptionsStruct).small_matrix_value);
                pdVar9[lVar16] = dVar23;
                dVar25 = pdVar15[iVar13] * dVar23;
                piVar28 = (int *)(local_1a8._M_current + dVar25);
                dVar23 = pdVar5[iVar13] / dVar23;
                if (ub <= dVar23) {
                  dVar23 = ub;
                }
                local_110 = local_110 +
                            ((double)local_1a8._M_current - ((double)piVar28 - dVar25)) +
                            (dVar25 - ((double)piVar28 - ((double)piVar28 - dVar25)));
                local_1a8._M_current = piVar28;
                ub = dVar23;
              }
              HVar30 = HighsCDouble::operator/(&local_1c8,dVar29);
              dVar22 = HVar30.hi + HVar30.lo;
              if (ub <= dVar22) {
                dVar22 = ub;
              }
              ub = dVar22;
              HighsCDouble::operator-=(&local_1c8,dVar29 * dVar22);
              slackind = (HighsInt)
                         ((ulong)((long)reducedcost.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)reducedcost.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 3);
              std::vector<double,_std::allocator<double>_>::push_back(&reducedcost,&ub);
              threshold = (double)local_1a8._M_current + local_110;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>(&upper,&threshold);
              for (lVar16 = 0;
                  (long)cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2 != lVar16; lVar16 = lVar16 + 1) {
                reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start
                [cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar16]] =
                     reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [cover.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar16]] -
                     ub * coefs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar16];
              }
              lVar20 = (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              dVar22 = local_210->primal_feastol;
              piVar14 = indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              for (lVar16 = lVar20 >> 4; 0 < lVar16; lVar16 = lVar16 + -1) {
                if (reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[*piVar14] <= dVar22) goto LAB_0030fbaf;
                if (reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[piVar14[1]] <= dVar22) {
                  piVar14 = piVar14 + 1;
                  goto LAB_0030fbaf;
                }
                if (reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[piVar14[2]] <= dVar22) {
                  piVar14 = piVar14 + 2;
                  goto LAB_0030fbaf;
                }
                if (reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[piVar14[3]] <= dVar22) {
                  piVar14 = piVar14 + 3;
                  goto LAB_0030fbaf;
                }
                piVar14 = piVar14 + 4;
                lVar20 = lVar20 + -0x10;
              }
              lVar20 = lVar20 >> 2;
              cVar27._M_current =
                   indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (lVar20 == 1) {
LAB_0030fb90:
                if (reducedcost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[*piVar14] <= dVar22) goto LAB_0030fbaf;
              }
              else {
                if (lVar20 == 2) {
LAB_0030fb82:
                  if (dVar22 < reducedcost.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[*piVar14]) {
                    piVar14 = piVar14 + 1;
                    goto LAB_0030fb90;
                  }
                }
                else {
                  if (lVar20 != 3) goto LAB_0030fbdd;
                  if (dVar22 < reducedcost.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start[*piVar14]) {
                    piVar14 = piVar14 + 1;
                    goto LAB_0030fb82;
                  }
                }
LAB_0030fbaf:
                cVar27._M_current = piVar14;
                if (piVar14 !=
                    indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  while (piVar14 = piVar14 + 1,
                        piVar14 !=
                        indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
                    if (dVar22 < reducedcost.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[*piVar14]) {
                      *cVar27._M_current = *piVar14;
                      cVar27._M_current = cVar27._M_current + 1;
                    }
                  }
                }
              }
LAB_0030fbdd:
              std::vector<int,_std::allocator<int>_>::erase
                        (&indices,cVar27,
                         (const_iterator)
                         indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              std::vector<int,_std::allocator<int>_>::push_back(&indices,&slackind);
            }
            HVar30 = HighsCDouble::operator+(&local_1c8,local_210->primal_feastol);
            threshold = HVar30.lo + HVar30.hi;
            local_1e0.reducedcost = &reducedcost;
            ub = (double)&positions;
            local_1d8 = (HighsCDouble *)&threshold;
            updateNonZeros.reducedcost = &reducedcost;
            updateNonZeros.indices = &positions;
            local_1a8._M_current =
                 indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            lVar20 = (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
            _Var19._M_current =
                 indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            updateNonZeros.maxviolation = local_1d8;
            for (lVar16 = lVar20 >> 4; 0 < lVar16; lVar16 = lVar16 + -1) {
              bVar21 = __gnu_cxx::__ops::
                       _Iter_pred<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::$_3>
                       ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:5580:34)>
                                     *)&updateNonZeros,_Var19);
              cVar27._M_current = _Var19._M_current;
              if (bVar21) goto LAB_0030fd77;
              bVar21 = __gnu_cxx::__ops::
                       _Iter_pred<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::$_3>
                       ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:5580:34)>
                                     *)&updateNonZeros,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     )(_Var19._M_current + 1));
              cVar27._M_current = _Var19._M_current + 1;
              if (bVar21) goto LAB_0030fd77;
              bVar21 = __gnu_cxx::__ops::
                       _Iter_pred<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::$_3>
                       ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:5580:34)>
                                     *)&updateNonZeros,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     )(_Var19._M_current + 2));
              cVar27._M_current = _Var19._M_current + 2;
              if (bVar21) goto LAB_0030fd77;
              bVar21 = __gnu_cxx::__ops::
                       _Iter_pred<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::$_3>
                       ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:5580:34)>
                                     *)&updateNonZeros,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     )(_Var19._M_current + 3));
              cVar27._M_current = _Var19._M_current + 3;
              if (bVar21) goto LAB_0030fd77;
              _Var19._M_current = _Var19._M_current + 4;
              lVar20 = lVar20 + -0x10;
            }
            lVar20 = lVar20 >> 2;
            if (lVar20 == 1) {
LAB_0030ff19:
              bVar21 = __gnu_cxx::__ops::
                       _Iter_pred<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::$_3>
                       ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:5580:34)>
                                     *)&updateNonZeros,_Var19);
              cVar27._M_current = _Var19._M_current;
              if (!bVar21) {
                cVar27._M_current = local_1a8._M_current;
              }
LAB_0030fd77:
              this = local_210;
              _Var19._M_current = cVar27._M_current;
              if (cVar27._M_current != local_1a8._M_current) {
                while (_Var19._M_current = _Var19._M_current + 1,
                      _Var19._M_current != local_1a8._M_current) {
                  bVar21 = __gnu_cxx::__ops::
                           _Iter_pred<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::$_3>
                           ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:5580:34)>
                                         *)&ub,_Var19);
                  if (!bVar21) {
                    *cVar27._M_current = *_Var19._M_current;
                    cVar27._M_current = cVar27._M_current + 1;
                  }
                }
              }
            }
            else {
              if (lVar20 == 2) {
LAB_0030feef:
                bVar21 = __gnu_cxx::__ops::
                         _Iter_pred<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::$_3>
                         ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:5580:34)>
                                       *)&updateNonZeros,_Var19);
                cVar27._M_current = _Var19._M_current;
                if (!bVar21) {
                  _Var19._M_current = _Var19._M_current + 1;
                  goto LAB_0030ff19;
                }
                goto LAB_0030fd77;
              }
              cVar27._M_current = local_1a8._M_current;
              this = local_210;
              if (lVar20 == 3) {
                bVar21 = __gnu_cxx::__ops::
                         _Iter_pred<presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::$_3>
                         ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_presolve_HPresolve_cpp:5580:34)>
                                       *)&updateNonZeros,_Var19);
                cVar27._M_current = _Var19._M_current;
                if (!bVar21) {
                  _Var19._M_current = _Var19._M_current + 1;
                  goto LAB_0030feef;
                }
                goto LAB_0030fd77;
              }
            }
            std::vector<int,_std::allocator<int>_>::erase(&indices,cVar27,local_1a8);
            uVar18 = local_1d0;
            if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              updateNonZeros.reducedcost = &reducedcost;
              updateNonZeros.indices = &indices;
              updateNonZeros.maxviolation = &local_1c8;
              updateNonZeros.positions = &positions;
              updateNonZeros.complementation = &complementation;
              updateNonZeros.this = this;
              if (0.0 <= local_118) {
                local_1e0.reducedcost = (vector<double,_std::allocator<double>_> *)0x0;
                ub = (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[local_1d0];
                strengthenInequalities::anon_class_48_6_c3dafeef::operator()
                          (&updateNonZeros,(HighsInt)local_1d0,(HighsCDouble *)&ub,1);
                dVar22 = ub + (double)local_1e0.reducedcost;
                pdVar15 = (this->model->row_upper_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              else {
                local_1e0.reducedcost = (vector<double,_std::allocator<double>_> *)0x0;
                ub = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[local_1d0];
                strengthenInequalities::anon_class_48_6_c3dafeef::operator()
                          (&updateNonZeros,(HighsInt)local_1d0,(HighsCDouble *)&ub,-1);
                dVar22 = ub + (double)local_1e0.reducedcost;
                pdVar15 = (this->model->row_lower_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              pdVar15[uVar18] = dVar22;
              *num_strengthened =
                   *num_strengthened +
                   (int)((ulong)((long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_finish -
                                (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2);
              uVar18 = local_1d0;
            }
          }
        }
        else {
          uVar18 = local_1d0;
          if (local_138._M_impl.super__Vector_impl_data._M_finish !=
              local_138._M_impl.super__Vector_impl_data._M_start) {
            local_138._M_impl.super__Vector_impl_data._M_finish =
                 local_138._M_impl.super__Vector_impl_data._M_start;
          }
        }
      }
    }
    uVar18 = uVar18 + 1;
  }
  local_120 = uVar10;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&cover.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&coefs.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_138);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&positions.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indices.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&upper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&reducedcost.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  return (Result)local_120;
}

Assistant:

HPresolve::Result HPresolve::strengthenInequalities(
    HighsPostsolveStack& postsolve_stack, HighsInt& num_strengthened) {
  std::vector<int8_t> complementation;
  std::vector<double> reducedcost;
  std::vector<double> upper;
  std::vector<HighsInt> indices;
  std::vector<HighsInt> positions;
  std::vector<HighsInt> stack;
  std::vector<double> coefs;
  std::vector<HighsInt> cover;

  num_strengthened = 0;
  // Check for timeout according to this frequency
  const HighsInt check_time_frequency = 100;

  for (HighsInt row = 0; row != model->num_row_; ++row) {
    if (rowsize[row] <= 1) continue;
    if (model->row_lower_[row] != -kHighsInf &&
        model->row_upper_[row] != kHighsInf)
      continue;

    // do not run on very dense rows as this could get expensive
    HighsInt rowsize_limit =
        std::max(HighsInt{1000}, (model->num_col_ - numDeletedCols) / 20);
    if (rowsize[row] > rowsize_limit) continue;

    // printf("strengthening knapsack of %" HIGHSINT_FORMAT " vars\n",
    // rowsize[row]);

    HighsCDouble maxviolation;
    HighsCDouble continuouscontribution = 0.0;
    double scale;

    if (model->row_lower_[row] != -kHighsInf) {
      // ax >= lb, treat as -ax <= -lb --> -ax + lb <= 0
      maxviolation = model->row_lower_[row];
      scale = -1.0;
    } else {
      // ax <= ub --> ax - ub <= 0
      maxviolation = -model->row_upper_[row];
      scale = 1.0;
    }

    complementation.clear();
    reducedcost.clear();
    upper.clear();
    indices.clear();
    positions.clear();
    complementation.reserve(rowsize[row]);
    reducedcost.reserve(rowsize[row]);
    upper.reserve(rowsize[row]);
    indices.reserve(rowsize[row]);
    positions.reserve(rowsize[row]);
    stack.reserve(rowsize[row]);
    stack.push_back(rowroot[row]);

    bool skiprow = false;

    while (!stack.empty()) {
      // pop element from stack
      HighsInt pos = stack.back();
      stack.pop_back();

      // add non-zeros to stack
      if (ARright[pos] != -1) stack.push_back(ARright[pos]);
      if (ARleft[pos] != -1) stack.push_back(ARleft[pos]);

      // get column index
      HighsInt col = Acol[pos];

      // skip row if a column bound is not finite
      skiprow = model->col_lower_[col] == -kHighsInf ||
                model->col_upper_[col] == kHighsInf;
      if (skiprow) break;

      // compute maximum violation
      // scale =  1:  ax <=  ub --> violation =  ax - ub > 0
      // scale = -1: -ax <= -lb --> violation = -ax + lb > 0
      // this means that for scale = 1 we sum up an upper bound on constraint
      // activity, and for scale = -1 we sum up a lower bound on constraint
      // activity.
      int8_t comp;
      double weight = Avalue[pos] * scale;
      double ub = model->col_upper_[col] - model->col_lower_[col];
      if (weight > 0) {
        comp = 1;
        maxviolation += model->col_upper_[col] * weight;
      } else {
        comp = -1;
        maxviolation += model->col_lower_[col] * weight;
        weight = -weight;
      }

      if (ub <= primal_feastol || weight <= primal_feastol) continue;

      if (model->integrality_[col] == HighsVarType::kContinuous) {
        continuouscontribution += weight * ub;
        continue;
      }

      indices.push_back(reducedcost.size());
      positions.push_back(pos);
      reducedcost.push_back(weight);
      complementation.push_back(comp);
      upper.push_back(ub);
    }

    // Check for timeout according to frequency, unless a particularly
    // dense row has just been analysed
    if ((row & check_time_frequency) == 0 || 10 * rowsize[row] > rowsize_limit)
      HPRESOLVE_CHECKED_CALL(checkTimeLimit());

    if (skiprow) {
      stack.clear();
      continue;
    }

    // maxviolation <= 0 implies that the constraint is redundant:
    // scale =  1: upper bound on activity <= model->row_upper_[row]
    // scale = -1: model->row_lower_[row]  <= lower bound on activity
    if (maxviolation <= primal_feastol) {
      HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
      continue;
    }

    const double smallVal =
        std::max(100 * primal_feastol,
                 primal_feastol * static_cast<double>(maxviolation));
    while (true) {
      if (maxviolation - continuouscontribution <= smallVal || indices.empty())
        break;

      pdqsort(indices.begin(), indices.end(), [&](HighsInt i1, HighsInt i2) {
        return std::make_pair(reducedcost[i1], i1) >
               std::make_pair(reducedcost[i2], i2);
      });

      HighsCDouble lambda = maxviolation - continuouscontribution;

      cover.clear();
      cover.reserve(indices.size());

      for (size_t i = indices.size(); i > 0; --i) {
        HighsInt index = indices[i - 1];
        double delta = upper[index] * reducedcost[index];

        if (upper[index] <= 1000.0 && reducedcost[index] > smallVal &&
            lambda - delta <= smallVal)
          cover.push_back(index);
        else
          lambda -= delta;
      }

      if (cover.empty() || lambda <= smallVal) break;

      HighsInt alpos = *std::min_element(
          cover.begin(), cover.end(), [&](HighsInt i1, HighsInt i2) {
            if (reducedcost[i1] <= 1e-3 || reducedcost[i2] <= 1e-3)
              return reducedcost[i1] > reducedcost[i2];
            return reducedcost[i1] < reducedcost[i2];
          });

      double al = reducedcost[alpos];
      coefs.resize(cover.size());
      double coverrhs = std::max(
          std::ceil(static_cast<double>(lambda / al - primal_feastol)), 1.0);
      HighsCDouble slackupper = -coverrhs;

      double step = kHighsInf;
      for (size_t i = 0; i != cover.size(); ++i) {
        coefs[i] = std::ceil(
            std::min(reducedcost[cover[i]], static_cast<double>(lambda)) / al -
            options->small_matrix_value);
        slackupper += upper[cover[i]] * coefs[i];
        step = std::min(step, reducedcost[cover[i]] / coefs[i]);
      }
      step = std::min(step, static_cast<double>(maxviolation / coverrhs));
      maxviolation -= step * coverrhs;

      HighsInt slackind = reducedcost.size();
      reducedcost.push_back(step);
      upper.push_back(static_cast<double>(slackupper));

      for (size_t i = 0; i != cover.size(); ++i)
        reducedcost[cover[i]] -= step * coefs[i];

      indices.erase(std::remove_if(indices.begin(), indices.end(),
                                   [&](HighsInt i) {
                                     return reducedcost[i] <= primal_feastol;
                                   }),
                    indices.end());
      indices.push_back(slackind);
    }

    double threshold = static_cast<double>(maxviolation + primal_feastol);

    indices.erase(std::remove_if(indices.begin(), indices.end(),
                                 [&](HighsInt i) {
                                   return static_cast<size_t>(i) >=
                                              positions.size() ||
                                          std::abs(reducedcost[i]) <= threshold;
                                 }),
                  indices.end());
    if (indices.empty()) continue;

    auto updateNonZeros = [&](HighsInt row, HighsCDouble& rhs,
                              HighsInt direction) {
      for (HighsInt i : indices) {
        assert(Arow[positions[i]] == row);
        double coefdelta =
            direction * static_cast<double>(reducedcost[i] - maxviolation);
        HighsInt col = Acol[positions[i]];

        if (complementation[i] == -1) {
          rhs += coefdelta * model->col_lower_[col];
          addToMatrix(row, col, coefdelta);
        } else {
          rhs -= coefdelta * model->col_upper_[col];
          addToMatrix(row, col, -coefdelta);
        }
      }
    };

    // update / add non-zeros
    if (scale < 0) {
      HighsCDouble lhs = model->row_lower_[row];
      updateNonZeros(row, lhs, HighsInt{-1});
      model->row_lower_[row] = static_cast<double>(lhs);
    } else {
      HighsCDouble rhs = model->row_upper_[row];
      updateNonZeros(row, rhs, HighsInt{1});
      model->row_upper_[row] = static_cast<double>(rhs);
    }

    num_strengthened += indices.size();
  }

  return Result::kOk;
}